

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLLoader.cpp
# Opt level: O1

void __thiscall
Assimp::MDLImporter::JoinSkins_3DGS_MDL7
          (MDLImporter *this,aiMaterial *pcMat1,aiMaterial *pcMat2,aiMaterial *pcMatOut)

{
  aiReturn aVar1;
  int iVal;
  aiString sString;
  undefined4 local_420;
  aiString local_41c;
  
  if (((pcMat1 != (aiMaterial *)0x0) && (pcMat2 != (aiMaterial *)0x0)) &&
     (pcMatOut != (aiMaterial *)0x0)) {
    aiMaterial::CopyPropertyList(pcMatOut,pcMat1);
    local_420 = 0;
    aiMaterial::AddBinaryProperty(pcMatOut,&local_420,4,"$tex.uvwsrc",1,0,aiPTI_Integer);
    local_41c.length = 0;
    local_41c.data[0] = '\0';
    memset(local_41c.data + 1,0x1b,0x3ff);
    aVar1 = aiGetMaterialString(pcMat2,"$tex.file",1,0,&local_41c);
    if (aVar1 == aiReturn_SUCCESS) {
      local_420 = 1;
      aiMaterial::AddBinaryProperty(pcMatOut,&local_420,4,"$tex.uvwsrc",1,1,aiPTI_Integer);
      aiMaterial::AddProperty(pcMatOut,&local_41c,"$tex.file",1,1);
    }
    return;
  }
  __assert_fail("__null != pcMat1 && __null != pcMat2 && __null != pcMatOut",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/MDL/MDLLoader.cpp"
                ,0x794,
                "void Assimp::MDLImporter::JoinSkins_3DGS_MDL7(aiMaterial *, aiMaterial *, aiMaterial *)"
               );
}

Assistant:

void MDLImporter::JoinSkins_3DGS_MDL7(
    aiMaterial* pcMat1,
    aiMaterial* pcMat2,
    aiMaterial* pcMatOut)
{
    ai_assert(NULL != pcMat1 && NULL != pcMat2 && NULL != pcMatOut);

    // first create a full copy of the first skin property set
    // and assign it to the output material
    aiMaterial::CopyPropertyList(pcMatOut,pcMat1);

    int iVal = 0;
    pcMatOut->AddProperty<int>(&iVal,1,AI_MATKEY_UVWSRC_DIFFUSE(0));

    // then extract the diffuse texture from the second skin,
    // setup 1 as UV source and we have it
    aiString sString;
    if(AI_SUCCESS == aiGetMaterialString ( pcMat2, AI_MATKEY_TEXTURE_DIFFUSE(0),&sString )) {
        iVal = 1;
        pcMatOut->AddProperty<int>(&iVal,1,AI_MATKEY_UVWSRC_DIFFUSE(1));
        pcMatOut->AddProperty(&sString,AI_MATKEY_TEXTURE_DIFFUSE(1));
    }
}